

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.cpp
# Opt level: O2

void wallet::RescanWallet
               (CWallet *wallet,WalletRescanReserver *reserver,int64_t time_begin,bool update)

{
  int64_t iVar1;
  UniValue *pUVar2;
  long in_FS_OFFSET;
  allocator<char> local_41;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = CWallet::RescanFromTime(wallet,time_begin,reserver,update);
  if (((wallet->fAbortRescan)._M_base._M_i & 1U) == 0) {
    if (time_begin < iVar1) {
      pUVar2 = (UniValue *)__cxa_allocate_exception(0x58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,
                 "Rescan was unable to fully rescan the blockchain. Some transactions may be missing."
                 ,&local_41);
      JSONRPCError(pUVar2,-4,&local_40);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        __cxa_throw(pUVar2,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
    else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else {
    pUVar2 = (UniValue *)__cxa_allocate_exception(0x58);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Rescan aborted by user.",&local_41);
    JSONRPCError(pUVar2,-1,&local_40);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      __cxa_throw(pUVar2,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  __stack_chk_fail();
}

Assistant:

static void RescanWallet(CWallet& wallet, const WalletRescanReserver& reserver, int64_t time_begin = TIMESTAMP_MIN, bool update = true)
{
    int64_t scanned_time = wallet.RescanFromTime(time_begin, reserver, update);
    if (wallet.IsAbortingRescan()) {
        throw JSONRPCError(RPC_MISC_ERROR, "Rescan aborted by user.");
    } else if (scanned_time > time_begin) {
        throw JSONRPCError(RPC_WALLET_ERROR, "Rescan was unable to fully rescan the blockchain. Some transactions may be missing.");
    }
}